

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<12UL> * __thiscall GF2::WW<12UL>::operator=(WW<12UL> *this,word wRight)

{
  word in_RSI;
  WW<12UL> *in_RDI;
  size_t pos;
  
  in_RDI->_words[0] = in_RSI;
  Trim(in_RDI);
  return in_RDI;
}

Assistant:

WW& operator=(word wRight)
	{	
		_words[0] = wRight;
		for (size_t pos = 1; pos < _wcount; pos++)
			_words[pos] = 0;
		Trim();
		return *this;
	}